

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_api_base.h
# Opt level: O1

void __thiscall
mp::BasicFlatModelAPI::AddConstraint<mp::NLBaseReif<1>>
          (BasicFlatModelAPI *this,NLBaseReif<1> *param_1)

{
  Error *this_00;
  long *plVar1;
  long *plVar2;
  CStringRef local_90;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Not handling constraint type \'","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
  local_70 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_70 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90.data_ = (char *)*plVar1;
  plVar2 = plVar1 + 2;
  if ((long *)local_90.data_ == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90.data_ = (char *)&local_80;
  }
  else {
    local_80 = *plVar2;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Error::Error(this_00,local_90,-1);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void AddConstraint(const Constraint& ) {
    MP_RAISE(
          std::string("Not handling constraint type '") +
          Constraint::GetTypeName() +
          "'. Provide a handler or a converter method");
  }